

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeForces.cpp
# Opt level: O1

void __thiscall
OpenMD::FluctuatingChargeForces::addType(FluctuatingChargeForces *this,AtomType *atomType)

{
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  size_t sVar3;
  bool bVar4;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar5;
  FluctuatingChargeAdapter fqa;
  int atid;
  FluctuatingChargeAdapter local_b0;
  value_type local_a8;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_50;
  
  p_Var1 = &local_a8.vself_.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8.vself_.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8.vself_.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_a8.vself_.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b0.at_ = atomType;
  local_a8.vself_.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var1;
  local_a8.vself_.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = p_Var1;
  bVar4 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_b0);
  if (bVar4) {
    local_a8.electronegativity = FluctuatingChargeAdapter::getElectronegativity(&local_b0);
    local_a8.hardness = FluctuatingChargeAdapter::getHardness(&local_b0);
    local_a8.slaterN = FluctuatingChargeAdapter::getSlaterN(&local_b0);
    local_a8.slaterZeta = FluctuatingChargeAdapter::getSlaterZeta(&local_b0);
    FluctuatingChargeAdapter::getSelfPolynomial((DoublePolynomial *)&local_50,&local_b0);
    std::
    _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
    ::clear((_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
             *)&local_a8.vself_);
    if (local_50._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      p_Var2 = &local_50._M_impl.super__Rb_tree_header;
      local_a8.vself_.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           local_50._M_impl.super__Rb_tree_header._M_header._M_color;
      local_a8.vself_.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           local_50._M_impl.super__Rb_tree_header._M_header._M_parent;
      local_a8.vself_.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           local_50._M_impl.super__Rb_tree_header._M_header._M_left;
      local_a8.vself_.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_50._M_impl.super__Rb_tree_header._M_header._M_right;
      (local_50._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = p_Var1;
      local_a8.vself_.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_node_count =
           local_50._M_impl.super__Rb_tree_header._M_node_count;
      local_50._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_50._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_50._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
      local_50._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
    ::~_Rb_tree(&local_50);
  }
  local_50._M_impl._0_4_ = AtomType::getIdent(atomType);
  sVar3 = (this->FQtypes)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  pVar5 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &this->FQtypes,(int *)&local_50);
  if (pVar5.second == false) {
    snprintf(painCave.errMsg,2000,
             "FluctuatingChargeForces already had a previous fluctuating charge entry with ident %d\n"
             ,(ulong)(uint)local_50._M_impl._0_4_);
    painCave.isFatal = 0;
    painCave.severity = 3;
    simError();
  }
  (this->FQtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[(int)local_50._M_impl._0_4_] = (int)sVar3;
  std::vector<OpenMD::FluctuatingChargeAtomData,_std::allocator<OpenMD::FluctuatingChargeAtomData>_>
  ::push_back(&this->FQMap,&local_a8);
  std::
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               *)&local_a8.vself_);
  return;
}

Assistant:

void FluctuatingChargeForces::addType(AtomType* atomType) {
    FluctuatingChargeAtomData data;
    FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
    if (fqa.isFluctuatingCharge()) {
      data.electronegativity = fqa.getElectronegativity();
      data.hardness          = fqa.getHardness();
      data.slaterN           = fqa.getSlaterN();
      data.slaterZeta        = fqa.getSlaterZeta();
      data.vself_            = fqa.getSelfPolynomial();
    }
    int atid  = atomType->getIdent();
    int fqtid = FQtypes.size();

    pair<set<int>::iterator, bool> ret;
    ret = FQtypes.insert(atid);
    if (ret.second == false) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "FluctuatingChargeForces already had a previous fluctuating "
               "charge entry with ident %d\n",
               atid);
      painCave.severity = OPENMD_INFO;
      painCave.isFatal  = 0;
      simError();
    }
    FQtids[atid] = fqtid;
    FQMap.push_back(data);
  }